

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

json_t * json_load_file(char *path,size_t flags,json_error_t *error)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  FILE *fp;
  json_t *result;
  json_error_t *error_local;
  size_t flags_local;
  char *path_local;
  
  jsonp_error_init(error,path);
  if (path == (char *)0x0) {
    error_set(error,(lex_t *)0x0,"wrong arguments");
    path_local = (char *)0x0;
  }
  else {
    __stream = fopen(path,"rb");
    if (__stream == (FILE *)0x0) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      error_set(error,(lex_t *)0x0,"unable to open %s: %s",path,pcVar2);
      path_local = (char *)0x0;
    }
    else {
      path_local = (char *)json_loadf((FILE *)__stream,flags,error);
      fclose(__stream);
    }
  }
  return (json_t *)path_local;
}

Assistant:

json_t *json_load_file(const char *path, size_t flags, json_error_t *error)
{
	json_t *result;
	FILE *fp;

	jsonp_error_init(error, path);

	if (path == NULL) {
		error_set(error, NULL, "wrong arguments");
		return NULL;
	}

	fp = fopen(path, "rb");
	if (!fp)
	{
		error_set(error, NULL, "unable to open %s: %s",
			path, strerror(errno));
		return NULL;
	}

	result = json_loadf(fp, flags, error);

	fclose(fp);
	return result;
}